

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O1

void __thiscall QWidgetPrivate::enforceNativeChildren(QWidgetPrivate *this)

{
  ushort uVar1;
  QWExtra *pQVar2;
  QWidget *this_00;
  ulong uVar3;
  
  if ((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
      super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
      super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl == (QWExtra *)0x0) {
    createExtra(this);
  }
  pQVar2 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  uVar1 = *(ushort *)&pQVar2->field_0x7c;
  if (((uVar1 & 0x20) == 0) &&
     (*(ushort *)&pQVar2->field_0x7c = uVar1 | 0x20, *(long *)&this->field_0x28 != 0)) {
    uVar3 = 0;
    do {
      this_00 = *(QWidget **)(*(long *)&this->field_0x20 + uVar3 * 8);
      if ((this_00 == (QWidget *)0x0) || ((*(byte *)(*(long *)&this_00->field_0x8 + 0x30) & 1) == 0)
         ) {
        this_00 = (QWidget *)0x0;
      }
      if (this_00 != (QWidget *)0x0) {
        QWidget::setAttribute(this_00,WA_NativeWindow,true);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < *(ulong *)&this->field_0x28);
  }
  return;
}

Assistant:

inline void enforceNativeChildren()
    {
        if (!extra)
            createExtra();

        if (extra->nativeChildrenForced)
            return;
        extra->nativeChildrenForced = 1;

        for (int i = 0; i < children.size(); ++i) {
            if (QWidget *child = qobject_cast<QWidget *>(children.at(i)))
                child->setAttribute(Qt::WA_NativeWindow);
        }
    }